

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O0

void readLogFile(BatchResultValues *batchResult,char *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this;
  allocator<char> local_941;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  int local_8dc;
  deUint8 local_8d8 [4];
  int numRead;
  deUint8 buf [1024];
  TestLogParser parser;
  undefined1 local_358 [8];
  TagParser resultHandler;
  ifstream in;
  char *filename_local;
  BatchResultValues *batchResult_local;
  
  _Var2 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream
            ((void *)((long)&resultHandler.m_testResultParser.m_curNumValue.field_2 + 8),filename,
             _Var2);
  TagParser::TagParser((TagParser *)local_358,batchResult);
  xe::TestLogParser::TestLogParser((TestLogParser *)(buf + 0x3f8),(TestLogHandler *)local_358);
  local_8dc = 0;
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      std::istream::read(resultHandler.m_testResultParser.m_curNumValue.field_2._M_local_buf + 8,
                         (long)local_8d8);
      local_8dc = std::istream::gcount();
      if (local_8dc < 1) break;
      xe::TestLogParser::parse((TestLogParser *)(buf + 0x3f8),local_8d8,(long)local_8dc);
    }
    std::ifstream::close();
    xe::TestLogParser::~TestLogParser((TestLogParser *)(buf + 0x3f8));
    TagParser::~TagParser((TagParser *)local_358);
    std::ifstream::~ifstream
              ((void *)((long)&resultHandler.m_testResultParser.m_curNumValue.field_2 + 8));
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"Failed to open \'",&local_941);
  std::operator+(&local_920,&local_940,filename);
  std::operator+(&local_900,&local_920,"\'");
  std::runtime_error::runtime_error(this,(string *)&local_900);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void readLogFile (BatchResultValues& batchResult, const char* filename)
{
	std::ifstream		in				(filename, std::ifstream::binary|std::ifstream::in);
	TagParser			resultHandler	(batchResult);
	xe::TestLogParser	parser			(&resultHandler);
	deUint8				buf				[1024];
	int					numRead			= 0;

	if (!in.good())
		throw std::runtime_error(string("Failed to open '") + filename + "'");

	for (;;)
	{
		in.read((char*)&buf[0], DE_LENGTH_OF_ARRAY(buf));
		numRead = (int)in.gcount();

		if (numRead <= 0)
			break;

		parser.parse(&buf[0], numRead);
	}

	in.close();
}